

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O2

RotationZZ<std::complex<float>_> *
qclab::qgates::operator/
          (RotationZZ<std::complex<float>_> *__return_storage_ptr__,
          RotationZZ<std::complex<float>_> *lhs,RotationZZ<std::complex<float>_> *rhs)

{
  int iVar1;
  angle_type aVar2;
  int iVar3;
  
  iVar1 = (lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems[0];
  iVar3 = (*(rhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar1 == iVar3) {
    RotationZZ<std::complex<float>_>::operator/=(lhs,rhs);
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_ =
         (lhs->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_;
    aVar2 = (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_;
    *(undefined8 *)
     (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems =
         *(undefined8 *)(lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).rotation_.angle_ = aVar2;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).
    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004cf350;
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZZ.hpp"
                ,0xd2,"RotationZZ<T> qclab::qgates::operator/(RotationZZ<T>, const RotationZZ<T> &)"
               );
}

Assistant:

RotationZZ< T > operator/( RotationZZ< T > lhs ,
                                         const RotationZZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }